

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::NonMaximumSuppression::MergePartialFromCodedStream
          (NonMaximumSuppression *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  NonMaximumSuppression_PickTop *value;
  string *psVar6;
  StringVector *value_00;
  Int64Vector *value_01;
  char *field_name;
  char cVar7;
  uint uVar8;
  int size;
  ulong uVar9;
  double *value_02;
  pointer data;
  
LAB_001ef256:
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar9 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
        goto LAB_001ef53d;
        uVar9 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar9 = uVar9 | 0x100000000;
    }
    else {
LAB_001ef53d:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_001ef2f8_caseD_cc;
    uVar8 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar7 = (char)uVar9;
    switch(uVar8) {
    case 200:
      if (cVar7 == 'B') {
        psVar6 = mutable_confidenceinputfeaturename_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) {
          return false;
        }
        psVar6 = (this->confidenceinputfeaturename_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        size = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName";
LAB_001ef4ba:
        bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (data,size,PARSE,field_name);
        if (!bVar4) {
          return false;
        }
        goto LAB_001ef256;
      }
      break;
    case 0xc9:
      if (cVar7 == 'J') {
        psVar6 = mutable_coordinatesinputfeaturename_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) {
          return false;
        }
        psVar6 = (this->coordinatesinputfeaturename_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        size = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName";
        goto LAB_001ef4ba;
      }
      break;
    case 0xca:
      if (cVar7 == 'R') {
        psVar6 = mutable_iouthresholdinputfeaturename_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) {
          return false;
        }
        psVar6 = (this->iouthresholdinputfeaturename_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        size = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName";
        goto LAB_001ef4ba;
      }
      break;
    case 0xcb:
      if (cVar7 == 'Z') {
        psVar6 = mutable_confidencethresholdinputfeaturename_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) {
          return false;
        }
        psVar6 = (this->confidencethresholdinputfeaturename_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        size = (int)psVar6->_M_string_length;
        field_name = 
        "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName";
        goto LAB_001ef4ba;
      }
      break;
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd0:
    case 0xd1:
      break;
    case 0xd2:
      if (cVar7 == -0x6e) {
        psVar6 = mutable_confidenceoutputfeaturename_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) {
          return false;
        }
        psVar6 = (this->confidenceoutputfeaturename_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        size = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName";
        goto LAB_001ef4ba;
      }
      break;
    case 0xd3:
      if (cVar7 == -0x66) {
        psVar6 = mutable_coordinatesoutputfeaturename_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar4) {
          return false;
        }
        psVar6 = (this->coordinatesoutputfeaturename_).ptr_;
        data = (psVar6->_M_dataplus)._M_p;
        size = (int)psVar6->_M_string_length;
        field_name = "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName";
        goto LAB_001ef4ba;
      }
      break;
    default:
      if (uVar8 != 0x6f) {
        if (uVar8 == 100) {
          if (cVar7 == '\"') {
            value_00 = mutable_stringclasslabels(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value_00);
            goto LAB_001ef2d4;
          }
        }
        else if (uVar8 == 0x65) {
          if (cVar7 == '*') {
            value_01 = mutable_int64classlabels(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_01);
            goto LAB_001ef2d4;
          }
        }
        else if (uVar8 == 0x6e) {
          value_02 = &this->iouthreshold_;
          if (cVar7 == 'q') goto LAB_001ef533;
        }
        else if ((uVar8 == 1) && (cVar7 == '\n')) {
          value = mutable_picktop(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::NonMaximumSuppression_PickTop>
                            (input,value);
          goto LAB_001ef2d4;
        }
        break;
      }
      value_02 = &this->confidencethreshold_;
      if (cVar7 != 'y') break;
LAB_001ef533:
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                        (input,value_02);
      goto LAB_001ef2d4;
    }
switchD_001ef2f8_caseD_cc:
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_001ef2d4:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NonMaximumSuppression::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NonMaximumSuppression)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_picktop()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double iouThreshold = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(881u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &iouthreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double confidenceThreshold = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(889u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &confidencethreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceInputFeatureName = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidenceinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidenceinputfeaturename().data(), this->confidenceinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string coordinatesInputFeatureName = 201;
      case 201: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1610u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_coordinatesinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->coordinatesinputfeaturename().data(), this->coordinatesinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string iouThresholdInputFeatureName = 202;
      case 202: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1618u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_iouthresholdinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->iouthresholdinputfeaturename().data(), this->iouthresholdinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceThresholdInputFeatureName = 203;
      case 203: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1626u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidencethresholdinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidencethresholdinputfeaturename().data(), this->confidencethresholdinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceOutputFeatureName = 210;
      case 210: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1682u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidenceoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidenceoutputfeaturename().data(), this->confidenceoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string coordinatesOutputFeatureName = 211;
      case 211: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1690u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_coordinatesoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->coordinatesoutputfeaturename().data(), this->coordinatesoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NonMaximumSuppression)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NonMaximumSuppression)
  return false;
#undef DO_
}